

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

size_t __thiscall
kj::Table<kj::TreeMap<kj::String,int>::Entry,kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>>
::eraseRange<0ul,char_const(&)[4],char_const(&)[4]>
          (Table<kj::TreeMap<kj::String,int>::Entry,kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>>
           *this,char (*begin) [4],char (*end) [4])

{
  Iterator b;
  Iterator e;
  HashIndex<kj::_::(anonymous_namespace)::StringHasher> *this_00;
  char (*pacVar1) [4];
  HashIndex<kj::_::(anonymous_namespace)::StringHasher> *this_01;
  size_t sVar2;
  ArrayPtr<kj::TreeMap<kj::String,_int>::Entry> table;
  Iterator local_90;
  ArrayPtr<kj::TreeMap<kj::String,_int>::Entry> local_78;
  Iterator local_68;
  undefined1 local_50 [8];
  IterRange<kj::_::BTreeImpl::Iterator> inner;
  char (*end_local) [4];
  char (*begin_local) [4];
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *this_local;
  
  inner.e._16_8_ = end;
  this_00 = get<0ul,kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>&>
                      ((HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)(this + 0x20));
  local_78 = Vector<kj::TreeMap<kj::String,_int>::Entry>::asPtr
                       ((Vector<kj::TreeMap<kj::String,_int>::Entry> *)this);
  pacVar1 = ::const(begin);
  TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>::
  seek<kj::TreeMap<kj::String,int>::Entry,char_const(&)[4]>
            (&local_68,(TreeIndex<kj::TreeMap<kj::String,int>::Callbacks> *)this_00,local_78,pacVar1
            );
  this_01 = get<0ul,kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>&>
                      ((HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)(this + 0x20));
  table = Vector<kj::TreeMap<kj::String,_int>::Entry>::asPtr
                    ((Vector<kj::TreeMap<kj::String,_int>::Entry> *)this);
  pacVar1 = ::const((char (*) [4])inner.e._16_8_);
  TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>::
  seek<kj::TreeMap<kj::String,int>::Entry,char_const(&)[4]>
            (&local_90,(TreeIndex<kj::TreeMap<kj::String,int>::Callbacks> *)this_01,table,pacVar1);
  b.leaf = (Leaf *)local_68._16_8_;
  b.tree = (NodeUnion *)local_68.leaf;
  b._16_8_ = local_90.tree;
  e.leaf = (Leaf *)local_90._16_8_;
  e.tree = (NodeUnion *)local_90.leaf;
  e._16_8_ = this_00;
  kj::_::iterRange<kj::_::BTreeImpl::Iterator>(b,e);
  sVar2 = eraseAllImpl<kj::_::IterRange<kj::_::BTreeImpl::Iterator>&>
                    (this,(IterRange<kj::_::BTreeImpl::Iterator> *)local_50);
  return sVar2;
}

Assistant:

size_t Table<Row, Indexes...>::eraseRange(BeginKey&& begin, EndKey&& end) {
  auto inner = _::iterRange(get<index>(indexes).seek(rows.asPtr(), kj::fwd<BeginKey>(begin)),
                            get<index>(indexes).seek(rows.asPtr(), kj::fwd<EndKey>(end)));
  return eraseAllImpl(inner);
}